

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreePrintBox(Acec_Box_t *pBox,Vec_Int_t *vAdds)

{
  Vec_Int_t *vAdds_local;
  Acec_Box_t *pBox_local;
  
  printf("Adders:\n");
  Acec_PrintAdders(pBox->vAdds,vAdds);
  printf("Inputs:\n");
  Vec_WecPrintLits(pBox->vLeafLits);
  printf("Outputs:\n");
  Vec_WecPrintLits(pBox->vRootLits);
  return;
}

Assistant:

void Acec_TreePrintBox( Acec_Box_t * pBox, Vec_Int_t * vAdds )
{
    printf( "Adders:\n" );
    Acec_PrintAdders( pBox->vAdds, vAdds );
    printf( "Inputs:\n" );
    Vec_WecPrintLits( pBox->vLeafLits );
    printf( "Outputs:\n" );
    Vec_WecPrintLits( pBox->vRootLits );
//    printf( "Node %d has level %d.\n", 3715, Gia_ObjLevelId(pBox->pGia, 3715) );
//    printf( "Node %d has level %d.\n", 167, Gia_ObjLevelId(pBox->pGia, 167) );
//    printf( "Node %d has level %d.\n", 278, Gia_ObjLevelId(pBox->pGia, 278) );
//    printf( "Node %d has level %d.\n", 597, Gia_ObjLevelId(pBox->pGia, 597) );
}